

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O3

void __thiscall
cfdcapi_script_TapscriptTreeAddTree1_Test::TestBody(cfdcapi_script_TapscriptTreeAddTree1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  char *witness_program;
  char *branch_hash;
  char *leaf_hash;
  char *tapscript;
  int ret;
  AssertHelper local_88;
  uint8_t leaf_version;
  uint8_t depth;
  AssertionResult gtest_ar;
  undefined1 local_68 [16];
  char *tree_str;
  void *handle;
  AssertHelper local_48;
  void *tree_handle;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  char *control_block;
  uint32_t branch_count;
  int tmp_ret;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  tree_handle = (void *)((ulong)tree_handle._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tree_handle,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tree_handle);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&branch_hash,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x1e9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&branch_hash,(Message *)&tree_handle)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&branch_hash);
    if (tree_handle != (void *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tree_handle != (void *)0x0)) {
        (**(code **)(*tree_handle + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  tree_handle = (void *)CONCAT71(tree_handle._1_7_,handle != (void *)0x0);
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&branch_hash);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&tree_handle,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tapscript,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x1ea,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&tapscript,(Message *)&branch_hash);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tapscript);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_68) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (branch_hash != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (branch_hash != (char *)0x0)) {
        (**(code **)(*(long *)branch_hash + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  tree_handle = (void *)0x0;
  ret = CfdInitializeTaprootScriptTree(handle,&tree_handle);
  branch_hash = (char *)((ulong)branch_hash._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&branch_hash,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&branch_hash);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tapscript,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x1ee,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tapscript,(Message *)&branch_hash);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tapscript);
    if (branch_hash != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (branch_hash != (char *)0x0)) {
        (**(code **)(*(long *)branch_hash + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (ret == 0) {
    ret = CfdSetInitialTapLeaf
                    (handle,tree_handle,
                     "20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac",0xc0);
    branch_hash = (char *)((ulong)branch_hash & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&branch_hash,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&branch_hash);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tapscript,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,499,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&tapscript,(Message *)&branch_hash)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tapscript);
      if (branch_hash != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (branch_hash != (char *)0x0)) {
          (**(code **)(*(long *)branch_hash + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdAddTapBranchByTapLeaf(handle,tree_handle,"51",0xc0);
    branch_hash = (char *)((ulong)branch_hash & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&branch_hash,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&branch_hash);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tapscript,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1f8,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&tapscript,(Message *)&branch_hash)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tapscript);
      if (branch_hash != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (branch_hash != (char *)0x0)) {
          (**(code **)(*(long *)branch_hash + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    ret = CfdAddTapBranchByTapLeaf
                    (handle,tree_handle,
                     "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac"
                     ,0xc0);
    branch_hash = (char *)((ulong)branch_hash & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&branch_hash,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&branch_hash);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tapscript,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1fd,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&tapscript,(Message *)&branch_hash)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tapscript);
      if (branch_hash != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (branch_hash != (char *)0x0)) {
          (**(code **)(*(long *)branch_hash + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    branch_count = 0;
    ret = CfdGetTapBranchCount(handle,tree_handle,&branch_count);
    branch_hash = (char *)((ulong)branch_hash & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&branch_hash,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&branch_hash);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tapscript,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x201,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&tapscript,(Message *)&branch_hash)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tapscript);
      if (branch_hash != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (branch_hash != (char *)0x0)) {
          (**(code **)(*(long *)branch_hash + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    branch_hash = (char *)CONCAT44(branch_hash._4_4_,2);
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)&gtest_ar,"2","branch_count",(int *)&branch_hash,&branch_count);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&branch_hash);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tapscript,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x202,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&tapscript,(Message *)&branch_hash)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tapscript);
      if (branch_hash != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (branch_hash != (char *)0x0)) {
          (**(code **)(*(long *)branch_hash + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    depth = '\0';
    leaf_version = '\0';
    branch_hash = (char *)0x0;
    tapscript = (char *)0x0;
    ret = CfdGetTapBranchData(handle,tree_handle,'\0',false,&branch_hash,&leaf_version,&tapscript,
                              &depth);
    witness_program = (char *)((ulong)witness_program._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&witness_program,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&witness_program);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&leaf_hash,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x20a,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&leaf_hash,(Message *)&witness_program);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_hash);
      if (witness_program != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (witness_program != (char *)0x0)) {
          (**(code **)(*(long *)witness_program + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      witness_program = (char *)((ulong)witness_program & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<int,unsigned_char>
                ((internal *)&gtest_ar,"0","depth",(int *)&witness_program,&depth);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&witness_program);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&leaf_hash,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x20c,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&leaf_hash,(Message *)&witness_program);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_hash);
        if (witness_program != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (witness_program != (char *)0x0)) {
            (**(code **)(*(long *)witness_program + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      witness_program = (char *)CONCAT44(witness_program._4_4_,0xc0);
      testing::internal::CmpHelperEQ<int,unsigned_char>
                ((internal *)&gtest_ar,"0xc0","leaf_version",(int *)&witness_program,&leaf_version);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&witness_program);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&leaf_hash,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x20d,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&leaf_hash,(Message *)&witness_program);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_hash);
        if (witness_program != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (witness_program != (char *)0x0)) {
            (**(code **)(*(long *)witness_program + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"a85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d675\"",
                 "branch_hash","a85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d675",
                 branch_hash);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&witness_program);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&leaf_hash,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x210,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&leaf_hash,(Message *)&witness_program);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_hash);
        if (witness_program != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (witness_program != (char *)0x0)) {
            (**(code **)(*(long *)witness_program + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ((internal *)&gtest_ar,"\"51\"","tapscript","51",tapscript);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&witness_program);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&leaf_hash,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x213,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&leaf_hash,(Message *)&witness_program);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_hash);
        if (witness_program != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (witness_program != (char *)0x0)) {
            (**(code **)(*(long *)witness_program + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(branch_hash);
      branch_hash = (char *)0x0;
      CfdFreeStringBuffer(tapscript);
      tapscript = (char *)0x0;
    }
    ret = CfdGetTapBranchData(handle,tree_handle,'\x01',false,&branch_hash,&leaf_version,&tapscript,
                              &depth);
    witness_program = (char *)((ulong)witness_program & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&witness_program,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&witness_program);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&leaf_hash,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x21c,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&leaf_hash,(Message *)&witness_program);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_hash);
      if (witness_program != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (witness_program != (char *)0x0)) {
          (**(code **)(*(long *)witness_program + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      witness_program = (char *)((ulong)witness_program & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<int,unsigned_char>
                ((internal *)&gtest_ar,"0","depth",(int *)&witness_program,&depth);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&witness_program);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&leaf_hash,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x21e,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&leaf_hash,(Message *)&witness_program);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_hash);
        if (witness_program != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (witness_program != (char *)0x0)) {
            (**(code **)(*(long *)witness_program + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      witness_program = (char *)CONCAT44(witness_program._4_4_,0xc0);
      testing::internal::CmpHelperEQ<int,unsigned_char>
                ((internal *)&gtest_ar,"0xc0","leaf_version",(int *)&witness_program,&leaf_version);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&witness_program);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&leaf_hash,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x21f,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&leaf_hash,(Message *)&witness_program);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_hash);
        if (witness_program != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (witness_program != (char *)0x0)) {
            (**(code **)(*(long *)witness_program + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb\"",
                 "branch_hash","e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb",
                 branch_hash);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&witness_program);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&leaf_hash,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x222,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&leaf_hash,(Message *)&witness_program);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_hash);
        if (witness_program != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (witness_program != (char *)0x0)) {
            (**(code **)(*(long *)witness_program + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac\""
                 ,"tapscript",
                 "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac"
                 ,tapscript);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&witness_program);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&leaf_hash,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x225,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&leaf_hash,(Message *)&witness_program);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_hash);
        if (witness_program != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (witness_program != (char *)0x0)) {
            (**(code **)(*(long *)witness_program + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(branch_hash);
      branch_hash = (char *)0x0;
      CfdFreeStringBuffer(tapscript);
      tapscript = (char *)0x0;
    }
    ret = CfdGetTapBranchData(handle,tree_handle,'\x01',true,&branch_hash,(uint8_t *)0x0,
                              (char **)0x0,&depth);
    witness_program = (char *)((ulong)witness_program & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&witness_program,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&witness_program);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&leaf_hash,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x22e,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&leaf_hash,(Message *)&witness_program);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_hash);
      if (witness_program != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (witness_program != (char *)0x0)) {
          (**(code **)(*(long *)witness_program + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      witness_program = (char *)((ulong)witness_program & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<int,unsigned_char>
                ((internal *)&gtest_ar,"0","depth",(int *)&witness_program,&depth);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&witness_program);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&leaf_hash,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x230,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&leaf_hash,(Message *)&witness_program);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_hash);
        if (witness_program != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (witness_program != (char *)0x0)) {
            (**(code **)(*(long *)witness_program + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"a625d1251a1100263fa9a77b81e9e6f46c2eb8d44b9f27b629875cc102efb0ec\"",
                 "branch_hash","a625d1251a1100263fa9a77b81e9e6f46c2eb8d44b9f27b629875cc102efb0ec",
                 branch_hash);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&witness_program);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&leaf_hash,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x233,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&leaf_hash,(Message *)&witness_program);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&leaf_hash);
        if (witness_program != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (witness_program != (char *)0x0)) {
            (**(code **)(*(long *)witness_program + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(branch_hash);
      branch_hash = (char *)0x0;
    }
    witness_program = (char *)0x0;
    leaf_hash = (char *)0x0;
    control_block = (char *)0x0;
    ret = CfdGetTaprootScriptTreeHash
                    (handle,tree_handle,
                     "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
                     &witness_program,&leaf_hash,&control_block);
    tree_str = (char *)((ulong)tree_str._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tree_str,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tree_str);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x240,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&tree_str);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (tree_str != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tree_str != (char *)0x0)) {
          (**(code **)(*(long *)tree_str + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"083a2209e2f0dc07e362bc1dfe195ed974f176358bc986d7c45b48d4deb363f7\"",
                 "witness_program",
                 "083a2209e2f0dc07e362bc1dfe195ed974f176358bc986d7c45b48d4deb363f7",witness_program)
      ;
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tree_str);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x244,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&tree_str);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (tree_str != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (tree_str != (char *)0x0)) {
            (**(code **)(*(long *)tree_str + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd\"","leaf_hash",
                 "4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd",leaf_hash);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tree_str);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x247,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&tree_str);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (tree_str != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (tree_str != (char *)0x0)) {
            (**(code **)(*(long *)tree_str + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfba85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d675e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb\""
                 ,"control_block",
                 "c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfba85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d675e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb"
                 ,control_block);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&tree_str);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x24a,pcVar2);
        testing::internal::AssertHelper::operator=(&local_88,(Message *)&tree_str);
        testing::internal::AssertHelper::~AssertHelper(&local_88);
        if (tree_str != (char *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (tree_str != (char *)0x0)) {
            (**(code **)(*(long *)tree_str + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(witness_program);
      witness_program = (char *)0x0;
      CfdFreeStringBuffer(leaf_hash);
      leaf_hash = (char *)0x0;
      CfdFreeStringBuffer(control_block);
      control_block = (char *)0x0;
    }
    tree_str = (char *)0x0;
    ret = CfdGetTaprootScriptTreeSrting(handle,tree_handle,&tree_str);
    local_88.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_88,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_88);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x255,pcVar2);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (ret == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar,
                 "\"{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}\""
                 ,"tree_str",
                 "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}"
                 ,tree_str);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_88);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x259,pcVar2);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer(tree_str);
      tree_str = (char *)0x0;
    }
    tmp_ret = CfdFreeTaprootScriptTreeHandle(handle,tree_handle);
    local_88.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","tmp_ret",(CfdErrorCode *)&local_88,&tmp_ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_88);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x25f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  ret = CfdGetLastErrorCode(handle);
  if (ret != 0) {
    branch_hash = (char *)0x0;
    ret = CfdGetLastErrorMessage(handle,&branch_hash);
    tapscript = (char *)((ulong)tapscript & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tapscript,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tapscript);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&witness_program,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x266,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&witness_program,(Message *)&tapscript);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&witness_program);
      if (tapscript != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tapscript != (char *)0x0)) {
          (**(code **)(*(long *)tapscript + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar2 = "";
    testing::internal::CmpHelperSTREQ((internal *)&gtest_ar,"\"\"","str_buffer","",branch_hash);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&tapscript);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&witness_program,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x267,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&witness_program,(Message *)&tapscript);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&witness_program);
      if (tapscript != (char *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (tapscript != (char *)0x0)) {
          (**(code **)(*(long *)tapscript + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer(branch_hash);
  }
  ret = CfdFreeHandle(handle);
  branch_hash = (char *)((ulong)branch_hash & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&branch_hash,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&branch_hash);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tapscript,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x26d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tapscript,(Message *)&branch_hash);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tapscript);
    if (branch_hash != (char *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (branch_hash != (char *)0x0)) {
        (**(code **)(*(long *)branch_hash + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(cfdcapi_script, TapscriptTreeAddTree1) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* tree_handle = nullptr;
  ret = CfdInitializeTaprootScriptTree(handle, &tree_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdSetInitialTapLeaf(handle, tree_handle,
        "20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac",
        0xc0);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTapBranchByTapLeaf(handle, tree_handle,
        "51",
        0xc0);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTapBranchByTapLeaf(handle, tree_handle,
        "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac",
        0xc0);
    EXPECT_EQ(kCfdSuccess, ret);

    uint32_t branch_count = 0;
    ret = CfdGetTapBranchCount(handle, tree_handle, &branch_count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2, branch_count);

    uint8_t depth = 0;
    uint8_t leaf_version = 0;
    char* branch_hash = nullptr;
    char* tapscript = nullptr;
    ret = CfdGetTapBranchData(handle, tree_handle,
        0, false, &branch_hash, &leaf_version, &tapscript, &depth);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(0, depth);
      EXPECT_EQ(0xc0, leaf_version);
      EXPECT_STREQ(
        "a85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d675",
        branch_hash);
      EXPECT_STREQ(
        "51",
        tapscript);
      CfdFreeStringBuffer(branch_hash);
      branch_hash = nullptr;
      CfdFreeStringBuffer(tapscript);
      tapscript = nullptr;
    }

    ret = CfdGetTapBranchData(handle, tree_handle,
        1, false, &branch_hash, &leaf_version, &tapscript, &depth);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(0, depth);
      EXPECT_EQ(0xc0, leaf_version);
      EXPECT_STREQ(
        "e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb",
        branch_hash);
      EXPECT_STREQ(
        "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac",
        tapscript);
      CfdFreeStringBuffer(branch_hash);
      branch_hash = nullptr;
      CfdFreeStringBuffer(tapscript);
      tapscript = nullptr;
    }

    ret = CfdGetTapBranchData(handle, tree_handle,
        1, true, &branch_hash, nullptr, nullptr, &depth);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(0, depth);
      EXPECT_STREQ(
        "a625d1251a1100263fa9a77b81e9e6f46c2eb8d44b9f27b629875cc102efb0ec",
        branch_hash);
      CfdFreeStringBuffer(branch_hash);
      branch_hash = nullptr;
    }

    char* witness_program = nullptr;
    char* leaf_hash = nullptr;
    char* control_block = nullptr;
    ret = CfdGetTaprootScriptTreeHash(handle, tree_handle,
        "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        &witness_program,
        &leaf_hash,
        &control_block);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "083a2209e2f0dc07e362bc1dfe195ed974f176358bc986d7c45b48d4deb363f7",
        witness_program);
      EXPECT_STREQ(
        "4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd",
        leaf_hash);
      EXPECT_STREQ(
        "c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfba85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d675e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb",
        control_block);
      CfdFreeStringBuffer(witness_program);
      witness_program = nullptr;
      CfdFreeStringBuffer(leaf_hash);
      leaf_hash = nullptr;
      CfdFreeStringBuffer(control_block);
      control_block = nullptr;
    }

    char* tree_str = nullptr;
    ret = CfdGetTaprootScriptTreeSrting(handle, tree_handle, &tree_str);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}",
        tree_str);
      CfdFreeStringBuffer(tree_str);
      tree_str = nullptr;
    }

    int tmp_ret = CfdFreeTaprootScriptTreeHandle(handle, tree_handle);
    EXPECT_EQ(kCfdSuccess, tmp_ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}